

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ia5.cc
# Opt level: O0

void * s2i_ASN1_IA5STRING(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *str)

{
  int iVar1;
  ASN1_IA5STRING *str_00;
  size_t len_s;
  ASN1_IA5STRING *ia5;
  char *str_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  if (str == (char *)0x0) {
    ERR_put_error(0x14,0,0x7c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ia5.cc"
                  ,0x2f);
  }
  else {
    str_00 = ASN1_IA5STRING_new();
    if (str_00 != (ASN1_IA5STRING *)0x0) {
      len_s = strlen(str);
      iVar1 = ASN1_STRING_set((ASN1_STRING *)str_00,str,len_s);
      if (iVar1 != 0) {
        return str_00;
      }
      ASN1_IA5STRING_free(str_00);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *s2i_ASN1_IA5STRING(const X509V3_EXT_METHOD *method,
                                const X509V3_CTX *ctx, const char *str) {
  ASN1_IA5STRING *ia5;
  if (!str) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NULL_ARGUMENT);
    return NULL;
  }
  if (!(ia5 = ASN1_IA5STRING_new())) {
    goto err;
  }
  if (!ASN1_STRING_set(ia5, str, strlen(str))) {
    ASN1_IA5STRING_free(ia5);
    goto err;
  }
  return ia5;
err:
  return NULL;
}